

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)> *
__thiscall
testing::internal::
FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
::With(MockSpec<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
       *__return_storage_ptr__,
      FunctionMocker<void_(const_pstore::brokerface::fifo_path_&,_const_pstore::broker::broker_command_&)>
      *this,Matcher<const_pstore::brokerface::fifo_path_&> *m,
      Matcher<const_pstore::broker::broker_command_&> *m_1)

{
  _Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  local_38;
  
  local_38.super__Tuple_impl<1UL,_testing::Matcher<const_pstore::broker::broker_command_&>_>.
  super__Head_base<1UL,_testing::Matcher<const_pstore::broker::broker_command_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::broker::broker_command_&>.vtable_ =
       (m_1->super_MatcherBase<const_pstore::broker::broker_command_&>).vtable_;
  local_38.super__Tuple_impl<1UL,_testing::Matcher<const_pstore::broker::broker_command_&>_>.
  super__Head_base<1UL,_testing::Matcher<const_pstore::broker::broker_command_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::broker::broker_command_&>.buffer_ =
       (m_1->super_MatcherBase<const_pstore::broker::broker_command_&>).buffer_;
  (m_1->super_MatcherBase<const_pstore::broker::broker_command_&>).vtable_ = (VTable *)0x0;
  local_38.super__Tuple_impl<1UL,_testing::Matcher<const_pstore::broker::broker_command_&>_>.
  super__Head_base<1UL,_testing::Matcher<const_pstore::broker::broker_command_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::broker::broker_command_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189830;
  local_38.super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::brokerface::fifo_path_&>.vtable_ =
       (m->super_MatcherBase<const_pstore::brokerface::fifo_path_&>).vtable_;
  local_38.super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::brokerface::fifo_path_&>.buffer_ =
       (m->super_MatcherBase<const_pstore::brokerface::fifo_path_&>).buffer_;
  (m->super_MatcherBase<const_pstore::brokerface::fifo_path_&>).vtable_ = (VTable *)0x0;
  local_38.super__Head_base<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_false>.
  _M_head_impl.super_MatcherBase<const_pstore::brokerface::fifo_path_&>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00189790;
  __return_storage_ptr__->function_mocker_ = this;
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  ::_Tuple_impl(&(__return_storage_ptr__->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
                ,&local_38);
  std::
  _Tuple_impl<0UL,_testing::Matcher<const_pstore::brokerface::fifo_path_&>,_testing::Matcher<const_pstore::broker::broker_command_&>_>
  ::~_Tuple_impl(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }